

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSet<QWidget_*> __thiscall QDockAreaLayout::usedSeparatorWidgets(QDockAreaLayout *this)

{
  int iVar1;
  long in_RSI;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  this->corners[0] = NoDockWidgetArea;
  this->corners[1] = NoDockWidgetArea;
  uVar4 = *(ulong *)(in_RSI + 0x218);
  iVar1 = (int)uVar4;
  QHash<QWidget_*,_QHashDummyValue>::reserve((QHash<QWidget_*,_QHashDummyValue> *)this,(long)iVar1);
  uVar2 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar1 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 8 != uVar2; uVar2 = uVar2 + 8) {
    QSet<QWidget_*>::operator<<
              ((QSet<QWidget_*> *)this,(QWidget **)(*(long *)(in_RSI + 0x210) + uVar2));
  }
  for (lVar3 = 0x40; lVar3 != 0x200; lVar3 = lVar3 + 0x70) {
    QDockAreaLayoutInfo::usedSeparatorWidgets((QDockAreaLayoutInfo *)&stack0xffffffffffffffd0);
    QSet<QWidget_*>::unite((QSet<QWidget_*> *)this,(QSet<QWidget_*> *)&stack0xffffffffffffffd0);
    QHash<QWidget_*,_QHashDummyValue>::~QHash
              ((QHash<QWidget_*,_QHashDummyValue> *)&stack0xffffffffffffffd0);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSet<QWidget_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QWidget*> QDockAreaLayout::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparators = separatorWidgets.size();
    result.reserve(numSeparators);
    for (int i = 0; i < numSeparators; ++i)
        result << separatorWidgets.at(i);
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        result += dock.usedSeparatorWidgets();
    }
    return result;
}